

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O0

shared_ptr<celero::Factory> __thiscall celero::Experiment::getFactory(Experiment *this)

{
  Impl *pIVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Pimpl<celero::Experiment::Impl> *in_RSI;
  shared_ptr<celero::Factory> sVar2;
  Experiment *this_local;
  
  pIVar1 = Pimpl<celero::Experiment::Impl>::operator->(in_RSI);
  std::shared_ptr<celero::Factory>::shared_ptr((shared_ptr<celero::Factory> *)this,&pIVar1->factory)
  ;
  sVar2.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Factory>)
         sVar2.super___shared_ptr<celero::Factory,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Factory> Experiment::getFactory() const
{
	return this->pimpl->factory;
}